

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_TagBox.cpp
# Opt level: O2

void __thiscall amrex::TagBox::tags(TagBox *this,Vector<int,_std::allocator<int>_> *ar,Box *tilebx)

{
  Box *this_00;
  char *pcVar1;
  int idim;
  long lVar2;
  int *piVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  char *pcVar9;
  int j;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  IntVect IVar13;
  int Ltb [3];
  int Lbx [3];
  Long stride [3];
  int local_80 [4];
  int local_70 [4];
  Vector<int,_std::allocator<int>_> *local_60;
  int local_58 [3];
  long local_48 [3];
  
  this_00 = &(this->super_BaseFab<char>).domain;
  local_60 = ar;
  IVar13 = Box::length(this_00);
  local_58[0] = IVar13.vect[0];
  local_58[1] = IVar13.vect[1];
  local_58[2] = IVar13.vect[2];
  local_70[0] = 1;
  local_70[1] = 1;
  local_70[2] = 1;
  for (lVar2 = 0; lVar2 != 3; lVar2 = lVar2 + 1) {
    local_70[lVar2] = local_58[lVar2];
  }
  local_48[0] = 1;
  lVar11 = (long)local_70[0];
  local_48[1] = lVar11;
  lVar6 = (long)local_70[1];
  local_48[2] = lVar6 * lVar11;
  local_80[0] = 1;
  local_80[1] = 1;
  local_80[2] = 1;
  lVar5 = 0;
  for (lVar2 = 0; lVar2 != 0xc; lVar2 = lVar2 + 4) {
    iVar4 = *(int *)((long)(tilebx->smallend).vect + lVar2);
    *(int *)((long)local_80 + lVar2) = (*(int *)((long)(tilebx->bigend).vect + lVar2) - iVar4) + 1;
    lVar5 = lVar5 + ((long)iVar4 - (long)*(int *)((long)(this_00->smallend).vect + lVar2)) *
                    *(long *)((long)local_48 + lVar2 * 2);
  }
  uVar12 = 0;
  pcVar1 = BaseFab<char>::dataPtr(&this->super_BaseFab<char>,0);
  pcVar1 = pcVar1 + lVar5;
  piVar3 = (local_60->super_vector<int,_std::allocator<int>_>).
           super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
  iVar4 = local_80[0];
  if (local_80[0] < 1) {
    iVar4 = 0;
  }
  uVar7 = (ulong)(uint)local_80[1];
  if (local_80[1] < 1) {
    uVar7 = uVar12;
  }
  uVar8 = (ulong)(uint)local_80[2];
  if (local_80[2] < 1) {
    uVar8 = uVar12;
  }
  for (; uVar12 != uVar8; uVar12 = uVar12 + 1) {
    pcVar9 = pcVar1;
    for (uVar10 = 0; uVar10 != uVar7; uVar10 = uVar10 + 1) {
      for (lVar2 = 0; iVar4 != (int)lVar2; lVar2 = lVar2 + 1) {
        if (*piVar3 != 0) {
          pcVar9[lVar2] = (char)*piVar3;
        }
        piVar3 = piVar3 + 1;
      }
      pcVar9 = pcVar9 + lVar11;
    }
    pcVar1 = pcVar1 + lVar6 * lVar11;
  }
  return;
}

Assistant:

void
TagBox::tags (const Vector<int>& ar, const Box& tilebx) noexcept
{
    auto dlen = length();
    int Lbx[] = {1,1,1};
    for (int idim=0; idim<AMREX_SPACEDIM; idim++) {
        Lbx[idim] = dlen[idim];
    }

    Long stride[] = {1, Lbx[0], Long(Lbx[0])*Long(Lbx[1])};

    Long stb=0;
    int Ltb[] = {1,1,1};
    for (int idim=0; idim<AMREX_SPACEDIM; idim++) {
        Ltb[idim] = tilebx.length(idim);
        stb += stride[idim] * (tilebx.smallEnd(idim) - domain.smallEnd(idim));
    }

    TagType* const p0   = dataPtr() + stb;  // +stb to the lower corner of tilebox
    const int*     iptr = ar.dataPtr();

    for (int k=0; k<Ltb[2]; k++) {
        for (int j=0; j<Ltb[1]; j++) {
            TagType* cptr = p0 + j*stride[1] + k*stride[2];
            for (int i=0; i<Ltb[0]; i++, cptr++, iptr++) {
                if (*iptr) *cptr = *iptr;
            }
        }
    }
}